

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O3

void calc_sad3_update_bestmv
               (FULLPEL_MOTION_SEARCH_PARAMS *ms_params,MV_COST_PARAMS *mv_cost_params,
               FULLPEL_MV *best_mv,FULLPEL_MV center_mv,uint8_t *center_address,uint *bestsad,
               uint *raw_bestsad,int search_step,int *best_site,int *chkpts_indices,int *cost_list)

{
  buf_2d *pbVar1;
  search_site_config *psVar2;
  short sVar3;
  int j;
  long lVar4;
  FULLPEL_MV FVar5;
  uint uVar6;
  FULLPEL_MV FVar7;
  FULLPEL_MV FVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  ushort uVar13;
  short sVar14;
  ushort uVar15;
  uint uVar16;
  ushort uVar17;
  uint local_68 [4];
  uint8_t *local_58;
  uint8_t *local_50;
  uint8_t *local_48;
  uint8_t *local_40;
  
  pbVar1 = (ms_params->ms_buffers).src;
  psVar2 = ms_params->search_sites;
  local_58 = center_address + psVar2->site[(uint)search_step][*chkpts_indices].offset;
  local_50 = center_address + psVar2->site[(uint)search_step][chkpts_indices[1]].offset;
  local_48 = center_address + psVar2->site[(uint)search_step][chkpts_indices[2]].offset;
  local_40 = center_address;
  (*ms_params->sdx3df)
            (pbVar1->buf,pbVar1->stride,&local_58,((ms_params->ms_buffers).ref)->stride,local_68);
  uVar6 = *bestsad;
  sVar10 = center_mv.row;
  sVar3 = center_mv.col;
  if (local_68[0] < uVar6) {
    sVar9 = psVar2->site[(uint)search_step][*chkpts_indices].mv.row + sVar10;
    sVar11 = psVar2->site[(uint)search_step][*chkpts_indices].mv.col + sVar3;
    if (mv_cost_params->mv_cost_type < 4) {
      sVar14 = sVar9 - (mv_cost_params->full_ref_mv).row;
      uVar15 = sVar14 * 8;
      sVar12 = sVar11 - (mv_cost_params->full_ref_mv).col;
      uVar13 = sVar12 * 8;
      switch(mv_cost_params->mv_cost_type) {
      case '\0':
        uVar16 = (mv_cost_params->mvcost[0][(short)uVar15] +
                  *(int *)((long)mv_cost_params->mvjcost +
                          (ulong)((uint)(uVar13 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                 mv_cost_params->mvcost[1][(short)uVar13]) * mv_cost_params->sad_per_bit + 0x100U >>
                 9;
        break;
      case '\x01':
        uVar17 = sVar14 * -8;
        if ((short)(sVar14 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar12 * -8;
        if ((short)(sVar12 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = ((uint)uVar15 + (uint)uVar17) * 4;
        break;
      case '\x02':
        uVar17 = sVar14 * -8;
        if ((short)(sVar14 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar12 * -8;
        if ((short)(sVar12 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = ((uint)uVar15 + (uint)uVar17) * 0xf >> 3;
        break;
      case '\x03':
        uVar17 = sVar14 * -8;
        if ((short)(sVar14 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar12 * -8;
        if ((short)(sVar12 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = (uint)uVar15 + (uint)uVar17;
      }
    }
    else {
      uVar16 = 0;
    }
    if (uVar16 + local_68[0] < uVar6) {
      if (raw_bestsad != (uint *)0x0) {
        *raw_bestsad = local_68[0];
      }
      *bestsad = uVar16 + local_68[0];
      FVar5.col = sVar11;
      FVar5.row = sVar9;
      *best_mv = FVar5;
      *best_site = 0;
      uVar6 = *bestsad;
    }
  }
  if (local_68[1] < uVar6) {
    sVar9 = psVar2->site[(uint)search_step][chkpts_indices[1]].mv.row + sVar10;
    sVar11 = psVar2->site[(uint)search_step][chkpts_indices[1]].mv.col + sVar3;
    if (mv_cost_params->mv_cost_type < 4) {
      sVar14 = sVar9 - (mv_cost_params->full_ref_mv).row;
      uVar15 = sVar14 * 8;
      sVar12 = sVar11 - (mv_cost_params->full_ref_mv).col;
      uVar13 = sVar12 * 8;
      switch(mv_cost_params->mv_cost_type) {
      case '\0':
        uVar16 = (mv_cost_params->mvcost[0][(short)uVar15] +
                  *(int *)((long)mv_cost_params->mvjcost +
                          (ulong)((uint)(uVar13 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                 mv_cost_params->mvcost[1][(short)uVar13]) * mv_cost_params->sad_per_bit + 0x100U >>
                 9;
        break;
      case '\x01':
        uVar17 = sVar14 * -8;
        if ((short)(sVar14 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar12 * -8;
        if ((short)(sVar12 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = ((uint)uVar15 + (uint)uVar17) * 4;
        break;
      case '\x02':
        uVar17 = sVar14 * -8;
        if ((short)(sVar14 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar12 * -8;
        if ((short)(sVar12 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = ((uint)uVar15 + (uint)uVar17) * 0xf >> 3;
        break;
      case '\x03':
        uVar17 = sVar14 * -8;
        if ((short)(sVar14 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar12 * -8;
        if ((short)(sVar12 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = (uint)uVar15 + (uint)uVar17;
      }
    }
    else {
      uVar16 = 0;
    }
    if (uVar16 + local_68[1] < uVar6) {
      if (raw_bestsad != (uint *)0x0) {
        *raw_bestsad = local_68[1];
      }
      *bestsad = uVar16 + local_68[1];
      FVar7.col = sVar11;
      FVar7.row = sVar9;
      *best_mv = FVar7;
      *best_site = 1;
      uVar6 = *bestsad;
    }
  }
  if (local_68[2] < uVar6) {
    sVar10 = psVar2->site[(uint)search_step][chkpts_indices[2]].mv.row + sVar10;
    sVar3 = sVar3 + psVar2->site[(uint)search_step][chkpts_indices[2]].mv.col;
    if (mv_cost_params->mv_cost_type < 4) {
      sVar11 = sVar10 - (mv_cost_params->full_ref_mv).row;
      uVar15 = sVar11 * 8;
      sVar9 = sVar3 - (mv_cost_params->full_ref_mv).col;
      uVar13 = sVar9 * 8;
      switch(mv_cost_params->mv_cost_type) {
      case '\0':
        uVar16 = (mv_cost_params->mvcost[0][(short)uVar15] +
                  *(int *)((long)mv_cost_params->mvjcost +
                          (ulong)((uint)(uVar13 != 0) * 4 + (uint)(uVar15 != 0) * 8)) +
                 mv_cost_params->mvcost[1][(short)uVar13]) * mv_cost_params->sad_per_bit + 0x100U >>
                 9;
        break;
      case '\x01':
        uVar17 = sVar11 * -8;
        if ((short)(sVar11 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar9 * -8;
        if ((short)(sVar9 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = ((uint)uVar15 + (uint)uVar17) * 4;
        break;
      case '\x02':
        uVar17 = sVar11 * -8;
        if ((short)(sVar11 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar9 * -8;
        if ((short)(sVar9 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = ((uint)uVar15 + (uint)uVar17) * 0xf >> 3;
        break;
      case '\x03':
        uVar17 = sVar11 * -8;
        if ((short)(sVar11 * -8) < 0) {
          uVar17 = uVar15;
        }
        uVar15 = sVar9 * -8;
        if ((short)(sVar9 * -8) < 0) {
          uVar15 = uVar13;
        }
        uVar16 = (uint)uVar15 + (uint)uVar17;
      }
    }
    else {
      uVar16 = 0;
    }
    if (uVar16 + local_68[2] < uVar6) {
      if (raw_bestsad != (uint *)0x0) {
        *raw_bestsad = local_68[2];
      }
      *bestsad = uVar16 + local_68[2];
      FVar8.col = sVar3;
      FVar8.row = sVar10;
      *best_mv = FVar8;
      *best_site = 2;
    }
  }
  if (cost_list != (int *)0x0) {
    lVar4 = 0;
    do {
      cost_list[(long)chkpts_indices[lVar4] + 1] = local_68[lVar4];
      lVar4 = lVar4 + 1;
    } while (lVar4 != 3);
  }
  return;
}

Assistant:

static inline void calc_sad3_update_bestmv(
    const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
    const MV_COST_PARAMS *mv_cost_params, FULLPEL_MV *best_mv,
    FULLPEL_MV center_mv, const uint8_t *center_address, unsigned int *bestsad,
    unsigned int *raw_bestsad, int search_step, int *best_site,
    const int *chkpts_indices, int *cost_list) {
  const struct buf_2d *const src = ms_params->ms_buffers.src;
  const struct buf_2d *const ref = ms_params->ms_buffers.ref;
  const search_site *site = ms_params->search_sites->site[search_step];
  unsigned char const *block_offset[4] = {
    center_address + site[chkpts_indices[0]].offset,
    center_address + site[chkpts_indices[1]].offset,
    center_address + site[chkpts_indices[2]].offset,
    center_address,
  };
  unsigned int sads[4];
  ms_params->sdx3df(src->buf, src->stride, block_offset, ref->stride, sads);
  for (int j = 0; j < 3; j++) {
    const int index = chkpts_indices[j];
    const FULLPEL_MV this_mv = { center_mv.row + site[index].mv.row,
                                 center_mv.col + site[index].mv.col };
    const int found_better_mv = update_mvs_and_sad(
        sads[j], &this_mv, mv_cost_params, bestsad, raw_bestsad, best_mv,
        /*second_best_mv=*/NULL);
    if (found_better_mv) *best_site = j;
  }
  if (cost_list) {
    for (int j = 0; j < 3; j++) {
      int index = chkpts_indices[j];
      cost_list[index + 1] = sads[j];
    }
  }
}